

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * diff(Bigint *a,Bigint *b)

{
  int iVar1;
  uint32 uVar2;
  uint uVar3;
  int iVar4;
  Bigint *pBVar5;
  Bigint *pBVar6;
  uint32 *puVar7;
  uint32 *puVar8;
  ulong uVar9;
  long lVar10;
  uint32 *puVar11;
  
  uVar3 = cmp(a,b);
  if (uVar3 == 0) {
    pBVar6 = Balloc(0);
    pBVar5 = (Bigint *)0x0;
    if (pBVar6 != (Bigint *)0x0) {
      pBVar6->wds = 1;
      pBVar6->x[0] = 0;
      pBVar5 = pBVar6;
    }
  }
  else {
    pBVar6 = a;
    if ((int)uVar3 < 0) {
      pBVar6 = b;
    }
    pBVar5 = Balloc(pBVar6->k);
    if (pBVar5 == (Bigint *)0x0) {
      pBVar5 = (Bigint *)0x0;
    }
    else {
      if ((int)uVar3 < 0) {
        b = a;
      }
      pBVar5->sign = uVar3 >> 0x1f;
      iVar4 = pBVar6->wds;
      iVar1 = b->wds;
      puVar11 = b->x;
      puVar7 = (uint32 *)&pBVar5->wds;
      uVar9 = 0;
      puVar8 = pBVar6->x;
      do {
        lVar10 = (ulong)*puVar8 - (*puVar11 + uVar9);
        puVar7[1] = (uint32)lVar10;
        puVar7 = puVar7 + 1;
        puVar8 = puVar8 + 1;
        puVar11 = puVar11 + 1;
        uVar9 = (ulong)((uint)((ulong)lVar10 >> 0x20) & 1);
      } while (puVar11 < b->x + iVar1);
      for (; puVar8 < pBVar6->x + iVar4; puVar8 = puVar8 + 1) {
        lVar10 = *puVar8 - uVar9;
        uVar9 = (ulong)((uint)((ulong)lVar10 >> 0x20) & 1);
        puVar7[1] = (int)lVar10;
        puVar7 = puVar7 + 1;
      }
      iVar4 = iVar4 + 1;
      do {
        iVar4 = iVar4 + -1;
        uVar2 = *puVar7;
        puVar7 = puVar7 + -1;
      } while (uVar2 == 0);
      pBVar5->wds = iVar4;
    }
  }
  return pBVar5;
}

Assistant:

static Bigint *
diff(Bigint *a, Bigint *b)
{
    Bigint *c;
    int i, wa, wb;
    ULong *xa, *xae, *xb, *xbe, *xc;
#ifdef ULLong
    ULLong borrow, y;
#else
    ULong borrow, y;
    ULong z;
#endif

    i = cmp(a,b);
    if (!i) {
        c = Balloc(0);
        if (c == NULL)
            return NULL;
        c->wds = 1;
        c->x[0] = 0;
        return c;
    }
    if (i < 0) {
        c = a;
        a = b;
        b = c;
        i = 1;
    }
    else
        i = 0;
    c = Balloc(a->k);
    if (c == NULL)
        return NULL;
    c->sign = i;
    wa = a->wds;
    xa = a->x;
    xae = xa + wa;
    wb = b->wds;
    xb = b->x;
    xbe = xb + wb;
    xc = c->x;
    borrow = 0;
#ifdef ULLong
    do {
        y = (ULLong)*xa++ - *xb++ - borrow;
        borrow = y >> 32 & (ULong)1;
        *xc++ = (ULong)(y & FFFFFFFF);
    }
    while(xb < xbe);
    while(xa < xae) {
        y = *xa++ - borrow;
        borrow = y >> 32 & (ULong)1;
        *xc++ = (ULong)(y & FFFFFFFF);
    }
#else
    do {
        y = (*xa & 0xffff) - (*xb & 0xffff) - borrow;
        borrow = (y & 0x10000) >> 16;
        z = (*xa++ >> 16) - (*xb++ >> 16) - borrow;
        borrow = (z & 0x10000) >> 16;
        Storeinc(xc, z, y);
    }
    while(xb < xbe);
    while(xa < xae) {
        y = (*xa & 0xffff) - borrow;
        borrow = (y & 0x10000) >> 16;
        z = (*xa++ >> 16) - borrow;
        borrow = (z & 0x10000) >> 16;
        Storeinc(xc, z, y);
    }
#endif
    while(!*--xc)
        wa--;
    c->wds = wa;
    return c;
}